

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O2

mcu8str * mctools_fileextension(mcu8str *__return_storage_ptr__,mcu8str *path)

{
  char *c_str;
  
  c_str = mctools_fileextension_view(path);
  mcu8str_create_from_cstr(__return_storage_ptr__,c_str);
  return __return_storage_ptr__;
}

Assistant:

mcu8str mctools_fileextension( const mcu8str* path )
  {
    const char * it = mctools_fileextension_view( path );
    return mcu8str_create_from_cstr( it );
  }